

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

bool __thiscall QWidgetPrivate::setMaximumSize_helper(QWidgetPrivate *this,int *maxw,int *maxh)

{
  ushort uVar1;
  QWidget *pQVar2;
  char *pcVar3;
  undefined8 uVar4;
  uint *puVar5;
  pointer pQVar6;
  uint *in_RDX;
  uint *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *q;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  uint uVar7;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  bool bVar8;
  QString *in_stack_ffffffffffffff08;
  bool local_b9;
  int local_b8 [14];
  char local_80 [32];
  int local_60 [14];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  bVar8 = true;
  if ((int)*in_RSI < 0x1000000) {
    bVar8 = 0xffffff < (int)*in_RDX;
  }
  if (bVar8) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QObject::objectName();
    QString::toLocal8Bit(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff08 =
         (QString *)
         QByteArray::data((QByteArray *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    (*(code *)**(undefined8 **)pQVar2)();
    uVar4 = QMetaObject::className();
    QMessageLogger::warning
              (local_28,"QWidget::setMaximumSize: (%s/%s) The largest allowed size is (%d,%d)",
               in_stack_ffffffffffffff08,uVar4,0xffffff);
    QByteArray::~QByteArray((QByteArray *)0x36b0ba);
    QString::~QString((QString *)0x36b0c7);
    local_60[1] = 0xffffff;
    puVar5 = (uint *)qMin<int>((int *)in_RSI,local_60 + 1);
    *in_RSI = *puVar5;
    local_60[0] = 0xffffff;
    puVar5 = (uint *)qMin<int>((int *)in_RDX,local_60);
    *in_RDX = *puVar5;
  }
  bVar8 = true;
  if (-1 < (int)*in_RSI) {
    bVar8 = (int)*in_RDX < 0;
  }
  if (bVar8 != false) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(bVar8,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
               ,in_stack_fffffffffffffef4,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QObject::objectName();
    QString::toLocal8Bit(in_stack_ffffffffffffff08);
    pcVar3 = QByteArray::data((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    (*(code *)**(undefined8 **)pQVar2)();
    uVar4 = QMetaObject::className();
    QMessageLogger::warning
              (local_80,"QWidget::setMaximumSize: (%s/%s) Negative sizes (%d,%d) are not possible",
               pcVar3,uVar4,(ulong)*in_RSI,(ulong)*in_RDX);
    QByteArray::~QByteArray((QByteArray *)0x36b1d9);
    QString::~QString((QString *)0x36b1e3);
    local_b8[1] = 0;
    puVar5 = (uint *)qMax<int>((int *)in_RSI,local_b8 + 1);
    *in_RSI = *puVar5;
    local_b8[0] = 0;
    puVar5 = (uint *)qMax<int>((int *)in_RDX,local_b8);
    *in_RDX = *puVar5;
  }
  createExtra((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36b23b);
  if ((pQVar6->maxw == *in_RSI) &&
     (pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36b255),
     pQVar6->maxh == *in_RDX)) {
    local_b9 = false;
  }
  else {
    uVar7 = *in_RSI;
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36b284);
    pQVar6->maxw = uVar7;
    uVar7 = *in_RDX;
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36b2a4);
    pQVar6->maxh = uVar7;
    uVar1 = 0;
    if (*in_RDX != 0xffffff) {
      uVar1 = 2;
    }
    uVar1 = *in_RSI != 0xffffff | uVar1;
    pQVar6 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                       ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36b2ed);
    *(ushort *)&pQVar6->field_0x7c = *(ushort *)&pQVar6->field_0x7c & 0xfff3 | (uVar1 & 3) << 2;
    local_b9 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b9;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::setMaximumSize_helper(int &maxw, int &maxh)
{
    Q_Q(QWidget);
    if (Q_UNLIKELY(maxw > QWIDGETSIZE_MAX || maxh > QWIDGETSIZE_MAX)) {
        qWarning("QWidget::setMaximumSize: (%s/%s) "
                "The largest allowed size is (%d,%d)",
                 q->objectName().toLocal8Bit().data(), q->metaObject()->className(), QWIDGETSIZE_MAX,
                QWIDGETSIZE_MAX);
        maxw = qMin<int>(maxw, QWIDGETSIZE_MAX);
        maxh = qMin<int>(maxh, QWIDGETSIZE_MAX);
    }
    if (Q_UNLIKELY(maxw < 0 || maxh < 0)) {
        qWarning("QWidget::setMaximumSize: (%s/%s) Negative sizes (%d,%d) "
                "are not possible",
                q->objectName().toLocal8Bit().data(), q->metaObject()->className(), maxw, maxh);
        maxw = qMax(maxw, 0);
        maxh = qMax(maxh, 0);
    }
    createExtra();
    if (extra->maxw == maxw && extra->maxh == maxh)
        return false;
    extra->maxw = maxw;
    extra->maxh = maxh;
    extra->explicitMaxSize = (maxw != QWIDGETSIZE_MAX ? Qt::Horizontal : 0) |
                             (maxh != QWIDGETSIZE_MAX ? Qt::Vertical : 0);
    return true;
}